

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

bool __thiscall QMap<int,_QString>::contains(QMap<int,_QString> *this,int *key)

{
  QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
  *pQVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
                 *)0x0) {
    return false;
  }
  p_Var4 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  p_Var2 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var2->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      if (*key <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < *key];
    } while (p_Var4 != (_Base_ptr)0x0);
  }
  p_Var4 = &p_Var2->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var2) && (p_Var4 = p_Var3, *key < (int)p_Var3[1]._M_color)) {
    p_Var4 = &p_Var2->_M_header;
  }
  return (_Rb_tree_header *)p_Var4 != p_Var2;
}

Assistant:

constexpr P get() const noexcept { return ptr; }